

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void calculate_group_size
               (Am_Value_List *list,int *min_left,int *min_top,int *max_right,int *max_bottom,
               Am_Object *owner)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  Am_Object cur_owner;
  Am_Object obj;
  Am_Object local_40;
  Am_Object local_38;
  
  *min_left = 29999;
  *min_top = 29999;
  *max_right = -29999;
  *max_bottom = -29999;
  obj.data = (Am_Object_Data *)0x0;
  cur_owner.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (bVar1) {
      Am_Object::~Am_Object(&cur_owner);
      Am_Object::~Am_Object(&obj);
      return;
    }
    pAVar7 = Am_Value_List::Get(list);
    Am_Object::operator=(&obj,pAVar7);
    Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&obj);
    Am_Object::operator=(&cur_owner,&local_38);
    Am_Object::~Am_Object(&local_38);
    bVar1 = Am_Object::Valid(&cur_owner);
    if (bVar1) {
      bVar1 = Am_Object::Valid(owner);
      if (bVar1) {
        bVar1 = Am_Object::operator!=(owner,&cur_owner);
        if (bVar1) {
          Am_Error("Moving objects from different groups.");
        }
      }
      else {
        Am_Object::operator=(owner,&cur_owner);
      }
    }
    Am_Object::Am_Object(&local_40,&Am_Line);
    bVar1 = Am_Object::Is_Instance_Of(&obj,&local_40);
    Am_Object::~Am_Object(&local_40);
    if (bVar1) {
      pAVar7 = Am_Object::Get(&obj,0x8b,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&obj,0x8d,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&obj,0x8c,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&obj,0x8e,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      iVar6 = *min_left;
      if (iVar2 <= *min_left) {
        iVar6 = iVar2;
      }
      if (iVar3 <= iVar6) {
        iVar6 = iVar3;
      }
      *min_left = iVar6;
      iVar6 = *min_top;
      if (iVar4 <= *min_top) {
        iVar6 = iVar4;
      }
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      *min_top = iVar6;
      iVar6 = *max_right;
      if (*max_right <= iVar2) {
        iVar6 = iVar2;
      }
      if (iVar3 < iVar6) {
        iVar3 = iVar6;
      }
      *max_right = iVar3;
      iVar3 = *max_bottom;
      if (*max_bottom <= iVar4) {
        iVar3 = iVar4;
      }
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
    }
    else {
      pAVar7 = Am_Object::Get(&obj,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&obj,0x65,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      iVar5 = *min_left;
      if (iVar3 <= *min_left) {
        iVar5 = iVar3;
      }
      *min_left = iVar5;
      iVar5 = *min_top;
      if (iVar6 <= *min_top) {
        iVar5 = iVar6;
      }
      *min_top = iVar5;
      iVar5 = *max_right;
      pAVar7 = Am_Object::Get(&obj,0x66,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar7);
      if (iVar5 <= iVar2 + iVar3) {
        iVar5 = iVar2 + iVar3;
      }
      *max_right = iVar5;
      iVar5 = *max_bottom;
      pAVar7 = Am_Object::Get(&obj,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      if (iVar5 <= iVar3 + iVar6) {
        iVar5 = iVar3 + iVar6;
      }
    }
    *max_bottom = iVar5;
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
calculate_group_size(Am_Value_List list, int &min_left, int &min_top,
                     int &max_right, int &max_bottom, Am_Object &owner)
{
  min_left = 29999;
  min_top = 29999;
  max_right = -29999;
  max_bottom = -29999;
  int cur_left, cur_top;
  Am_Object obj, cur_owner;
  for (list.Start(); !list.Last(); list.Next()) {
    obj = list.Get();
    cur_owner = obj.Get_Owner();
    if (cur_owner.Valid()) {
      if (!owner.Valid())
        owner = cur_owner;
      else if (owner != cur_owner)
        Am_Error("Moving objects from different groups.");
    }
    if (obj.Is_Instance_Of(Am_Line)) {
      int x1, x2, y1, y2;
      x1 = obj.Get(Am_X1);
      x2 = obj.Get(Am_X2);
      y1 = obj.Get(Am_Y1);
      y2 = obj.Get(Am_Y2);
      min_left = IMIN(IMIN(min_left, x1), x2);
      min_top = IMIN(IMIN(min_top, y1), y2);
      max_right = IMAX(IMAX(max_right, x1), x2);
      max_bottom = IMAX(IMAX(max_bottom, y1), y2);
    } else {
      cur_left = obj.Get(Am_LEFT);
      cur_top = obj.Get(Am_TOP);
      min_left = IMIN(min_left, cur_left);
      min_top = IMIN(min_top, cur_top);
      max_right = IMAX(max_right, cur_left + (int)obj.Get(Am_WIDTH));
      max_bottom = IMAX(max_bottom, cur_top + (int)obj.Get(Am_HEIGHT));
    }
  }
}